

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O3

rb_result_t rb_tree_remove(rb_tree *tree,rb_tree_node *node)

{
  rb_tree_node **pprVar1;
  int iVar2;
  rb_tree_node *prVar3;
  rb_tree_node *prVar4;
  rb_tree_node *yp;
  rb_tree_node *prVar5;
  rb_tree_node *prVar6;
  rb_tree_node *prVar7;
  rb_tree_node *xp_4;
  rb_tree_node *prVar8;
  rb_tree *prVar9;
  rb_tree_node *x_2;
  rb_tree_node *y;
  rb_tree_node *yleft;
  long *in_FS_OFFSET;
  bool bVar10;
  
  if (tree == (rb_tree *)0x0) {
    rb_tree_remove_cold_2();
LAB_00114664:
    rb_tree_remove_cold_1();
    if (in_FS_OFFSET[-0x42] == 0) {
      in_FS_OFFSET[-0x42] = *in_FS_OFFSET + -0x200;
      return (rb_result_t)(*in_FS_OFFSET + -0x200);
    }
    return (rb_result_t)in_FS_OFFSET[-0x42];
  }
  if (node == (rb_tree_node *)0x0) goto LAB_00114664;
  prVar8 = node->left;
  prVar6 = node;
  if (prVar8 == (rb_tree_node *)0x0) {
    prVar5 = node;
    if (tree->rightmost == node) {
      do {
        prVar7 = prVar5->parent;
        if (prVar7 == (rb_tree_node *)0x0) {
          prVar7 = (rb_tree_node *)0x0;
          break;
        }
        bVar10 = prVar5 == prVar7->left;
        prVar5 = prVar7;
      } while (bVar10);
LAB_001142c5:
      tree->rightmost = prVar7;
    }
    if (prVar8 != (rb_tree_node *)0x0) goto LAB_001142d9;
LAB_001142d0:
    prVar8 = prVar6->right;
    if (prVar8 != (rb_tree_node *)0x0) goto LAB_001142d9;
    prVar5 = prVar6->parent;
    prVar8 = (rb_tree_node *)0x0;
  }
  else {
    prVar5 = node->right;
    if (node->right != (rb_tree_node *)0x0) {
      do {
        prVar6 = prVar5;
        prVar5 = prVar6->left;
      } while (prVar6->left != (rb_tree_node *)0x0);
      goto LAB_001142d0;
    }
    prVar5 = prVar8;
    if (tree->rightmost == node) {
      do {
        prVar7 = prVar5;
        prVar5 = prVar7->right;
      } while (prVar7->right != (rb_tree_node *)0x0);
      goto LAB_001142c5;
    }
LAB_001142d9:
    prVar5 = prVar6->parent;
    prVar8->parent = prVar5;
  }
  bVar10 = false;
  prVar9 = tree;
  if (prVar5 != (rb_tree_node *)0x0) {
    bVar10 = prVar6 == prVar5->left;
    prVar9 = (rb_tree *)(&prVar5->left + !bVar10);
  }
  prVar9->root = prVar8;
  iVar2 = prVar6->color;
  if (prVar6 == node) goto LAB_0011437b;
  prVar7 = node->left;
  prVar3 = node->right;
  prVar4 = node->parent;
  prVar6->parent = prVar4;
  if (prVar4 == (rb_tree_node *)0x0) {
    prVar9 = tree;
    if (tree->root == node) goto LAB_00114334;
  }
  else {
    prVar9 = (rb_tree *)(&prVar4->left + (prVar4->left != node));
LAB_00114334:
    prVar9->root = prVar6;
  }
  prVar6->right = prVar3;
  if (prVar3 != (rb_tree_node *)0x0) {
    prVar3->parent = prVar6;
  }
  node->right = (rb_tree_node *)0x0;
  prVar6->left = prVar7;
  if (prVar7 != (rb_tree_node *)0x0) {
    prVar7->parent = prVar6;
  }
  node->left = (rb_tree_node *)0x0;
  prVar6->color = node->color;
  node->parent = (rb_tree_node *)0x0;
  if (prVar5 == node) {
    prVar5 = prVar6;
  }
LAB_0011437b:
  if (iVar2 == 0) {
    if (tree->root != prVar8) {
      do {
        if ((prVar8 != (rb_tree_node *)0x0) && (prVar8->color != 0)) goto LAB_00114640;
        pprVar1 = &prVar5->right;
        prVar8 = (rb_tree_node *)pprVar1;
        if (!bVar10) {
          prVar8 = prVar5;
        }
        prVar6 = prVar8->left;
        if (prVar6 == (rb_tree_node *)0x0) {
LAB_0011450b:
          prVar6 = prVar5->parent;
          bVar10 = false;
          prVar8 = prVar5;
          if (prVar6 == (rb_tree_node *)0x0) {
            prVar6 = (rb_tree_node *)0x0;
          }
          else {
            bVar10 = prVar5 == prVar6->left;
          }
        }
        else {
          if (prVar6->color == 1) {
            prVar6->color = 0;
            prVar5->color = 1;
            if (bVar10) {
              prVar6 = *pprVar1;
              prVar7 = prVar6->left;
              *pprVar1 = prVar7;
              if (prVar7 != (rb_tree_node *)0x0) {
                prVar7->parent = prVar5;
              }
              prVar7 = prVar5->parent;
              prVar6->parent = prVar7;
              prVar9 = tree;
              if (prVar7 != (rb_tree_node *)0x0) {
                prVar9 = (rb_tree *)(&prVar7->left + (prVar7->left != prVar5));
              }
              prVar9->root = prVar6;
              prVar6->left = prVar5;
            }
            else {
              prVar6 = prVar5->left;
              prVar7 = prVar6->right;
              prVar5->left = prVar7;
              if (prVar7 != (rb_tree_node *)0x0) {
                prVar7->parent = prVar5;
              }
              prVar7 = prVar5->parent;
              prVar6->parent = prVar7;
              prVar9 = tree;
              if (prVar7 != (rb_tree_node *)0x0) {
                prVar9 = (rb_tree *)(&prVar7->left + (prVar7->left != prVar5));
              }
              prVar9->root = prVar6;
              prVar6->right = prVar5;
            }
            prVar5->parent = prVar6;
            prVar6 = prVar8->left;
            if (prVar6 == (rb_tree_node *)0x0) goto LAB_0011450b;
          }
          prVar8 = prVar6->left;
          prVar7 = prVar6->right;
          if ((prVar8 == (rb_tree_node *)0x0) || (prVar8->color == 0)) {
            if ((prVar7 == (rb_tree_node *)0x0) || (prVar7->color == 0)) {
              prVar6->color = 1;
              goto LAB_0011450b;
            }
            if (bVar10) goto LAB_00114586;
            if ((prVar8 == (rb_tree_node *)0x0) || (prVar8->color == 0)) {
              prVar6->color = 1;
              prVar7->color = 0;
              prVar8 = prVar7->left;
              prVar6->right = prVar8;
              if (prVar8 != (rb_tree_node *)0x0) {
                prVar8->parent = prVar6;
              }
              prVar8 = prVar6->parent;
              prVar7->parent = prVar8;
              prVar9 = tree;
              if (prVar8 != (rb_tree_node *)0x0) {
                prVar9 = (rb_tree *)(&prVar8->left + (prVar8->left != prVar6));
              }
              prVar9->root = prVar7;
              prVar7->left = prVar6;
              prVar6->parent = prVar7;
              prVar8 = prVar5;
              goto LAB_0011457c;
            }
LAB_001144f0:
            prVar6->color = prVar5->color;
            prVar5->color = 0;
LAB_001145e2:
            if ((!bVar10) && (prVar8 != (rb_tree_node *)0x0)) {
              prVar8->color = 0;
              prVar8 = prVar5->left;
              prVar6 = prVar8->right;
              prVar5->left = prVar6;
              if (prVar6 != (rb_tree_node *)0x0) {
                prVar6->parent = prVar5;
              }
              prVar6 = prVar5->parent;
              prVar8->parent = prVar6;
              prVar9 = tree;
              if (prVar6 != (rb_tree_node *)0x0) {
                prVar9 = (rb_tree *)(&prVar6->left + (prVar6->left != prVar5));
              }
              prVar9->root = prVar8;
              prVar8->right = prVar5;
              prVar5->parent = prVar8;
            }
          }
          else {
            if (!bVar10) goto LAB_001144f0;
            if ((prVar7 == (rb_tree_node *)0x0) || (prVar7->color == 0)) {
              prVar6->color = 1;
              prVar8->color = 0;
              prVar7 = prVar8->right;
              prVar6->left = prVar7;
              if (prVar7 != (rb_tree_node *)0x0) {
                prVar7->parent = prVar6;
              }
              prVar7 = prVar6->parent;
              prVar8->parent = prVar7;
              prVar9 = tree;
              if (prVar7 != (rb_tree_node *)0x0) {
                prVar9 = (rb_tree *)(&prVar7->left + (prVar7->left != prVar6));
              }
              prVar9->root = prVar8;
              prVar8->right = prVar6;
              prVar6->parent = prVar8;
              prVar8 = (rb_tree_node *)pprVar1;
LAB_0011457c:
              prVar6 = prVar8->left;
              prVar8 = prVar6->left;
              prVar7 = prVar6->right;
            }
LAB_00114586:
            prVar6->color = prVar5->color;
            prVar5->color = 0;
            if ((!bVar10) || (prVar7 == (rb_tree_node *)0x0)) goto LAB_001145e2;
            prVar7->color = 0;
            prVar8 = *pprVar1;
            prVar6 = prVar8->left;
            *pprVar1 = prVar6;
            if (prVar6 != (rb_tree_node *)0x0) {
              prVar6->parent = prVar5;
            }
            prVar6 = prVar5->parent;
            prVar8->parent = prVar6;
            prVar9 = tree;
            if (prVar6 != (rb_tree_node *)0x0) {
              prVar9 = (rb_tree *)(&prVar6->left + (prVar6->left != prVar5));
            }
            prVar9->root = prVar8;
            prVar8->left = prVar5;
            prVar5->parent = prVar8;
          }
          prVar6 = prVar5;
          prVar8 = tree->root;
        }
        prVar5 = prVar6;
      } while (prVar8 != tree->root);
    }
    if (prVar8 != (rb_tree_node *)0x0) {
LAB_00114640:
      prVar8->color = 0;
    }
  }
  node->left = (rb_tree_node *)0x0;
  node->right = (rb_tree_node *)0x0;
  node->parent = (rb_tree_node *)0x0;
  return 0;
}

Assistant:

rb_result_t rb_tree_remove(struct rb_tree *tree,
                           struct rb_tree_node *node)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(node != NULL);

    struct rb_tree_node *y;


    if (node->left == NULL || node->right == NULL) {
        y = node;
        if (node == tree->rightmost) {
            /* The new rightmost item is our successor */
            tree->rightmost = __helper_rb_tree_find_predecessor(node);
        }
    } else {
        y = __helper_rb_tree_find_successor(node);
    }

    struct rb_tree_node *x, *xp;

    if (y->left != NULL) {
        x = y->left;
    } else {
        x = y->right;
    }

    if (x != NULL) {
        x->parent = y->parent;
        xp = x->parent;
    } else {
        xp = y->parent;
    }

    int is_left = 0;
    if (y->parent == NULL) {
        tree->root = x;
        xp = NULL;
    } else {
        struct rb_tree_node *yp = y->parent;
        if (y == yp->left) {
            yp->left = x;
            is_left = 1;
        } else {
            yp->right = x;
            is_left = 0;
        }
    }

    int y_color = y->color;

    /* Swap in the node */
    if (y != node) {
        __helper_rb_tree_swap_node(tree, node, y);
        if (xp == node) {
            xp = y;
        }
    }

    if (y_color == COLOR_BLACK) {
        __helper_rb_tree_delete_rebalance(tree, x, xp, is_left);
    }

    node->parent = NULL;
    node->left = NULL;
    node->right = NULL;

    return ret;
}